

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilterBase.cpp
# Opt level: O2

void __thiscall
UnscentedKalmanFilterBase_computeSigmaWeights_Test::TestBody
          (UnscentedKalmanFilterBase_computeSigmaWeights_Test *this)

{
  T *this_00;
  Scalar *pSVar1;
  char *pcVar2;
  long index;
  undefined1 local_fc [8];
  ConcreteUKF<Kalman::Vector<float,_3>_> ukf;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::UnscentedKalmanFilterBase
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_fc,1.0,2.0,1.0);
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::computeWeights
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_fc);
  this_00 = &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)this_00,"2","ukf.gamma",2.0,
             ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.beta);
  if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)this_00,"1","ukf.lambda",1.0,
               ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.kappa);
    if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma._0_1_ == '\0') {
      testing::Message::Message((Message *)&gtest_ar.message_);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                 ,0x27,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)this_00,"0.25","ukf.sigmaWeights_m[0]",0.25,
                 ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                 super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
                 super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [1]);
      if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma._0_1_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar.message_);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                   ,0x29,pcVar2);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)this_00,"2.25","ukf.sigmaWeights_c[0]",2.25,
                   ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
                   super_Matrix<float,_7,_1>.
                   super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                   array[5]);
        if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma._0_1_ != '\0') {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar);
          index = 1;
          while( true ) {
            if (index == 7) {
              return;
            }
            pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1> *)
                                ((long)&ukf.
                                        super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                        sigmaWeights_m.super_Matrix<float,_7,_1>.
                                        super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                        m_storage.m_data + 0x14),index);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)this_00,"0.125","ukf.sigmaWeights_c[i]",0.125,*pSVar1);
            if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma._0_1_ == '\0')
            break;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar);
            pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1> *)
                                ((long)&ukf.
                                        super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                        super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.
                                        super_Matrix<float,_3,_1>.
                                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                        m_storage + 4),index);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)this_00,"0.125","ukf.sigmaWeights_m[i]",0.125,*pSVar1);
            if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma._0_1_ == '\0')
            {
              testing::Message::Message((Message *)&gtest_ar.message_);
              if (gtest_ar._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_38,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                         ,0x2f,pcVar2);
              testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
              goto LAB_00184071;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar);
            index = index + 1;
          }
          testing::Message::Message((Message *)&gtest_ar.message_);
          if (gtest_ar._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                     ,0x2e,pcVar2);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
LAB_00184071:
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar.message_);
          goto code_r0x00184083;
        }
        testing::Message::Message((Message *)&gtest_ar.message_);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                   ,0x2a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar.message_);
code_r0x00184083:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  return;
}

Assistant:

TEST(UnscentedKalmanFilterBase, computeSigmaWeights) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = ConcreteUKF<Vector<T, 3>>(alpha,beta,kappa);
    ukf.computeWeights();
    
    ASSERT_FLOAT_EQ(2, ukf.gamma);
    ASSERT_FLOAT_EQ(1, ukf.lambda);
    
    ASSERT_FLOAT_EQ(0.25, ukf.sigmaWeights_m[0]);
    ASSERT_FLOAT_EQ(2.25, ukf.sigmaWeights_c[0]);
    
    for(size_t i = 1; i < 7; i++)
    {
        ASSERT_FLOAT_EQ(0.125, ukf.sigmaWeights_c[i]);
        ASSERT_FLOAT_EQ(0.125, ukf.sigmaWeights_m[i]);
    }
}